

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRule>::emplace<QMimeMagicRule>
          (QMovableArrayOps<QMimeMagicRule> *this,qsizetype i,QMimeMagicRule *args)

{
  QMimeMagicRule **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QMimeMagicRule *pQVar5;
  QMimeMagicRule *pQVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char *pcVar9;
  MatchFunction MVar10;
  int iVar11;
  quint32 qVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QArrayDataPointer<QMimeMagicRule> local_b8;
  Type local_a0;
  Data *local_98;
  char *pcStack_90;
  qsizetype local_88;
  undefined8 uStack_80;
  Data *local_78;
  char *pcStack_70;
  qsizetype local_68;
  Data *local_60;
  char *pcStack_58;
  qsizetype local_50;
  undefined8 local_48;
  MatchFunction MStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004c63d2:
    memset(&local_b8,0xaa,0x88);
    local_b8.d = (args->m_subMatches).d.d;
    local_b8.ptr = (args->m_subMatches).d.ptr;
    (args->m_subMatches).d.d = (Data *)0x0;
    (args->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
    local_b8.size = (args->m_subMatches).d.size;
    (args->m_subMatches).d.size = 0;
    local_a0 = args->m_type;
    local_98 = (args->m_value).d.d;
    pcStack_90 = (args->m_value).d.ptr;
    (args->m_value).d.d = (Data *)0x0;
    (args->m_value).d.ptr = (char *)0x0;
    local_88 = (args->m_value).d.size;
    uStack_80._0_4_ = args->m_startPos;
    uStack_80._4_4_ = args->m_endPos;
    (args->m_value).d.size = 0;
    local_78 = (args->m_mask).d.d;
    pcStack_70 = (args->m_mask).d.ptr;
    (args->m_mask).d.d = (Data *)0x0;
    (args->m_mask).d.ptr = (char *)0x0;
    local_68 = (args->m_mask).d.size;
    (args->m_mask).d.size = 0;
    local_60 = (args->m_pattern).d.d;
    pcStack_58 = (args->m_pattern).d.ptr;
    (args->m_pattern).d.d = (Data *)0x0;
    (args->m_pattern).d.ptr = (char *)0x0;
    local_50 = (args->m_pattern).d.size;
    (args->m_pattern).d.size = 0;
    local_48._0_4_ = args->m_number;
    local_48._4_4_ = args->m_numberMask;
    MStack_40 = args->m_matchFunction;
    local_38 = *(undefined8 *)&args->field_0x80;
    bVar13 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.
             size != 0;
    QArrayDataPointer<QMimeMagicRule>::detachAndGrow
              ((QArrayDataPointer<QMimeMagicRule> *)this,(uint)(i == 0 && bVar13),1,
               (QMimeMagicRule **)0x0,(QArrayDataPointer<QMimeMagicRule> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.
             ptr;
    if (i == 0 && bVar13) {
      pQVar5[-1].m_subMatches.d.d = local_b8.d;
      pQVar5[-1].m_subMatches.d.ptr = local_b8.ptr;
      pQVar5[-1].m_subMatches.d.size = local_b8.size;
      pQVar5[-1].m_type = local_a0;
      pQVar5[-1].m_value.d.d = local_98;
      pQVar5[-1].m_value.d.ptr = pcStack_90;
      pQVar5[-1].m_value.d.size = local_88;
      pQVar5[-1].m_startPos = (undefined4)uStack_80;
      pQVar5[-1].m_endPos = uStack_80._4_4_;
      pQVar5[-1].m_mask.d.d = local_78;
      pQVar5[-1].m_mask.d.ptr = pcStack_70;
      pQVar5[-1].m_mask.d.size = local_68;
      pQVar5[-1].m_pattern.d.d = local_60;
      pQVar5[-1].m_pattern.d.ptr = pcStack_58;
      pQVar5[-1].m_pattern.d.size = local_50;
      pQVar5[-1].m_number = (undefined4)local_48;
      pQVar5[-1].m_numberMask = local_48._4_4_;
      pQVar5[-1].m_matchFunction = MStack_40;
      *(undefined8 *)&pQVar5[-1].field_0x80 = local_38;
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRule>).
                 super_QArrayDataPointer<QMimeMagicRule>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar6 = pQVar5 + i;
      memmove(pQVar6 + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QMimeMagicRule>).
               super_QArrayDataPointer<QMimeMagicRule>.size - i) * 0x88);
      (pQVar6->m_subMatches).d.d = local_b8.d;
      (pQVar6->m_subMatches).d.ptr = local_b8.ptr;
      (pQVar6->m_subMatches).d.size = local_b8.size;
      pQVar6->m_type = local_a0;
      (pQVar6->m_value).d.d = local_98;
      (pQVar6->m_value).d.ptr = pcStack_90;
      (pQVar6->m_value).d.size = local_88;
      pQVar6->m_startPos = (undefined4)uStack_80;
      pQVar6->m_endPos = uStack_80._4_4_;
      (pQVar6->m_mask).d.d = local_78;
      (pQVar6->m_mask).d.ptr = pcStack_70;
      (pQVar6->m_mask).d.size = local_68;
      (pQVar6->m_pattern).d.d = local_60;
      (pQVar6->m_pattern).d.ptr = pcStack_58;
      (pQVar6->m_pattern).d.size = local_50;
      pQVar6->m_number = (undefined4)local_48;
      pQVar6->m_numberMask = local_48._4_4_;
      pQVar6->m_matchFunction = MStack_40;
      *(undefined8 *)&pQVar6->field_0x80 = local_38;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>
              .size;
    *pqVar2 = *pqVar2 + 1;
    local_50 = 0;
    pcStack_58 = (char *)0x0;
    local_60 = (Data *)0x0;
    local_68 = 0;
    pcStack_70 = (char *)0x0;
    local_78 = (Data *)0x0;
    local_88 = 0;
    pcStack_90 = (char *)0x0;
    local_98 = (Data *)0x0;
    local_b8.size = 0;
    local_b8.ptr = (QMimeMagicRule *)0x0;
    local_b8.d = (Data *)0x0;
    QArrayDataPointer<QMimeMagicRule>::~QArrayDataPointer(&local_b8);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.
            size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QMimeMagicRule>).
                      super_QArrayDataPointer<QMimeMagicRule>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0xf0f0f0f0f0f0f0f)) {
      pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRule>).
               super_QArrayDataPointer<QMimeMagicRule>.ptr;
      pDVar3 = (args->m_subMatches).d.d;
      (args->m_subMatches).d.d = (Data *)0x0;
      pQVar5[lVar4].m_subMatches.d.d = pDVar3;
      pQVar6 = (args->m_subMatches).d.ptr;
      (args->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
      pQVar5[lVar4].m_subMatches.d.ptr = pQVar6;
      qVar7 = (args->m_subMatches).d.size;
      (args->m_subMatches).d.size = 0;
      pQVar5[lVar4].m_subMatches.d.size = qVar7;
      pQVar5[lVar4].m_type = args->m_type;
      pDVar8 = (args->m_value).d.d;
      (args->m_value).d.d = (Data *)0x0;
      pQVar5[lVar4].m_value.d.d = pDVar8;
      pcVar9 = (args->m_value).d.ptr;
      (args->m_value).d.ptr = (char *)0x0;
      pQVar5[lVar4].m_value.d.ptr = pcVar9;
      qVar7 = (args->m_value).d.size;
      (args->m_value).d.size = 0;
      pQVar5[lVar4].m_value.d.size = qVar7;
      iVar11 = args->m_endPos;
      pQVar5[lVar4].m_startPos = args->m_startPos;
      pQVar5[lVar4].m_endPos = iVar11;
      pDVar8 = (args->m_mask).d.d;
      (args->m_mask).d.d = (Data *)0x0;
      pQVar5[lVar4].m_mask.d.d = pDVar8;
      pcVar9 = (args->m_mask).d.ptr;
      (args->m_mask).d.ptr = (char *)0x0;
      pQVar5[lVar4].m_mask.d.ptr = pcVar9;
      qVar7 = (args->m_mask).d.size;
      (args->m_mask).d.size = 0;
      pQVar5[lVar4].m_mask.d.size = qVar7;
      pDVar8 = (args->m_pattern).d.d;
      (args->m_pattern).d.d = (Data *)0x0;
      pQVar5[lVar4].m_pattern.d.d = pDVar8;
      pcVar9 = (args->m_pattern).d.ptr;
      (args->m_pattern).d.ptr = (char *)0x0;
      pQVar5[lVar4].m_pattern.d.ptr = pcVar9;
      qVar7 = (args->m_pattern).d.size;
      (args->m_pattern).d.size = 0;
      pQVar5[lVar4].m_pattern.d.size = qVar7;
      qVar12 = args->m_numberMask;
      MVar10 = args->m_matchFunction;
      pQVar6 = pQVar5 + lVar4;
      pQVar6->m_number = args->m_number;
      pQVar6->m_numberMask = qVar12;
      *(MatchFunction *)(&pQVar6->m_number + 2) = MVar10;
      *(undefined8 *)&pQVar5[lVar4].field_0x80 = *(undefined8 *)&args->field_0x80;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QMimeMagicRule *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.ptr
         )) goto LAB_004c63d2;
      pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRule>).
               super_QArrayDataPointer<QMimeMagicRule>.ptr;
      pDVar3 = (args->m_subMatches).d.d;
      (args->m_subMatches).d.d = (Data *)0x0;
      pQVar5[-1].m_subMatches.d.d = pDVar3;
      pQVar6 = (args->m_subMatches).d.ptr;
      (args->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
      pQVar5[-1].m_subMatches.d.ptr = pQVar6;
      qVar7 = (args->m_subMatches).d.size;
      (args->m_subMatches).d.size = 0;
      pQVar5[-1].m_subMatches.d.size = qVar7;
      pQVar5[-1].m_type = args->m_type;
      pDVar8 = (args->m_value).d.d;
      (args->m_value).d.d = (Data *)0x0;
      pQVar5[-1].m_value.d.d = pDVar8;
      pcVar9 = (args->m_value).d.ptr;
      (args->m_value).d.ptr = (char *)0x0;
      pQVar5[-1].m_value.d.ptr = pcVar9;
      qVar7 = (args->m_value).d.size;
      (args->m_value).d.size = 0;
      pQVar5[-1].m_value.d.size = qVar7;
      iVar11 = args->m_endPos;
      pQVar5[-1].m_startPos = args->m_startPos;
      pQVar5[-1].m_endPos = iVar11;
      pDVar8 = (args->m_mask).d.d;
      (args->m_mask).d.d = (Data *)0x0;
      pQVar5[-1].m_mask.d.d = pDVar8;
      pcVar9 = (args->m_mask).d.ptr;
      (args->m_mask).d.ptr = (char *)0x0;
      pQVar5[-1].m_mask.d.ptr = pcVar9;
      qVar7 = (args->m_mask).d.size;
      (args->m_mask).d.size = 0;
      pQVar5[-1].m_mask.d.size = qVar7;
      pDVar8 = (args->m_pattern).d.d;
      (args->m_pattern).d.d = (Data *)0x0;
      pQVar5[-1].m_pattern.d.d = pDVar8;
      pcVar9 = (args->m_pattern).d.ptr;
      (args->m_pattern).d.ptr = (char *)0x0;
      pQVar5[-1].m_pattern.d.ptr = pcVar9;
      qVar7 = (args->m_pattern).d.size;
      (args->m_pattern).d.size = 0;
      pQVar5[-1].m_pattern.d.size = qVar7;
      qVar12 = args->m_numberMask;
      MVar10 = args->m_matchFunction;
      pQVar5[-1].m_number = args->m_number;
      pQVar5[-1].m_numberMask = qVar12;
      pQVar5[-1].m_matchFunction = MVar10;
      *(undefined8 *)&pQVar5[-1].field_0x80 = *(undefined8 *)&args->field_0x80;
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRule>).
                 super_QArrayDataPointer<QMimeMagicRule>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }